

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_tester.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CommandLineInterfaceTester::CreateTempFile
          (CommandLineInterfaceTester *this,string_view name,string_view contents)

{
  char *pcVar1;
  size_t this_00;
  bool bVar2;
  Nonnull<const_char_*> failure_msg;
  undefined8 extraout_RAX;
  char *pcVar3;
  StatusRep *pSVar4;
  AlphaNum *c;
  size_type in_R9;
  StatusRep *pSVar5;
  StatusRep *pSVar6;
  string_view s;
  string_view contents_00;
  FixedMapping replacements;
  string full_name;
  string local_f8;
  Status local_d8;
  undefined1 local_d0 [48];
  lts_20250127 *local_a0;
  AlphaNum *local_98;
  AlphaNum local_90;
  undefined1 local_60 [48];
  
  c = (AlphaNum *)contents._M_str;
  local_a0 = (lts_20250127 *)contents._M_len;
  pcVar3 = name._M_str;
  pSVar4 = (StatusRep *)name._M_len;
  pSVar5 = pSVar4;
  if (pSVar4 == (StatusRep *)0x0) {
LAB_00c38318:
    pSVar6 = (StatusRep *)0xffffffffffffffff;
  }
  else {
    do {
      pSVar6 = (StatusRep *)
               ((long)&pSVar5[-1].payloads_._M_t.
                       super___uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                       .
                       super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
                       ._M_head_impl + 7);
      if (pSVar5 == (StatusRep *)0x0) goto LAB_00c38318;
      pcVar1 = pcVar3 + -1 + (long)pSVar5;
      pSVar5 = pSVar6;
    } while (*pcVar1 != '/');
  }
  local_98 = c;
  if (pSVar6 != (StatusRep *)0xffffffffffffffff) {
    if (pSVar4 < pSVar6) {
      pSVar6 = pSVar4;
    }
    local_d0._8_8_ = (this->temp_directory_)._M_dataplus._M_p;
    local_d0._0_8_ = (this->temp_directory_)._M_string_length;
    local_60._0_8_ = 1;
    local_60._8_8_ = "/";
    local_90.piece_._M_len = (size_t)pSVar6;
    local_90.piece_._M_str = pcVar3;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_f8,(lts_20250127 *)local_d0,(AlphaNum *)local_60,&local_90,c);
    bVar2 = File::Exists(&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      local_d0._8_8_ = (this->temp_directory_)._M_dataplus._M_p;
      local_d0._0_8_ = (this->temp_directory_)._M_string_length;
      local_60._0_8_ = 1;
      local_60._8_8_ = "/";
      local_90.piece_._M_len = (size_t)pSVar6;
      local_90.piece_._M_str = pcVar3;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_f8,(lts_20250127 *)local_d0,(AlphaNum *)local_60,&local_90,c);
      File::RecursivelyCreateDir((File *)&local_d8,&local_f8,0x1ff);
      if ((StatusRep *)local_d8.rep_ != (StatusRep *)0x1) {
        absl::lts_20250127::status_internal::MakeCheckFailString
                  (&local_d8,
                   "File::RecursivelyCreateDir( absl::StrCat(temp_directory_, \"/\", dir), 0777) is OK"
                  );
      }
      if ((local_d8.rep_ & 1) == 0) {
        absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_d8.rep_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((StatusRep *)local_d8.rep_ != (StatusRep *)0x1) {
        CreateTempFile();
        __clang_call_terminate(extraout_RAX);
      }
    }
  }
  local_d0._8_8_ = (this->temp_directory_)._M_dataplus._M_p;
  local_d0._0_8_ = (this->temp_directory_)._M_string_length;
  local_60._0_8_ = 1;
  local_60._8_8_ = "/";
  local_90.piece_._M_len = (size_t)pSVar4;
  local_90.piece_._M_str = pcVar3;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_f8,(lts_20250127 *)local_d0,(AlphaNum *)local_60,&local_90,c);
  local_60._0_8_ = 7;
  local_60._8_8_ = "$tmpdir";
  local_60._24_8_ = (this->temp_directory_)._M_dataplus._M_p;
  local_60._16_8_ = (this->temp_directory_)._M_string_length;
  s._M_str = local_60;
  s._M_len = (size_t)local_98;
  replacements._M_len = in_R9;
  replacements._M_array = (iterator)0x1;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_((string *)local_d0,local_a0,s,replacements);
  contents_00._M_str = (char *)local_d0._8_8_;
  contents_00._M_len = (size_t)&local_90;
  File::WriteStringToFile(contents_00,(string *)local_d0._0_8_);
  this_00 = local_90.piece_._M_len;
  if ((StatusRep *)local_90.piece_._M_len == (StatusRep *)0x1) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                            ((Nonnull<const_absl::Status_*>)&local_90,
                             "File::SetContents( full_name, absl::StrReplaceAll(contents, {{\"$tmpdir\", temp_directory_}}), true) is OK"
                            );
  }
  if ((this_00 & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)this_00);
  }
  if ((string *)local_d0._0_8_ != (string *)(local_d0 + 0x10)) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  if ((StatusRep *)this_00 != (StatusRep *)0x1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
               ,0x6b,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_d0)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CommandLineInterfaceTester::CreateTempFile(absl::string_view name,
                                                absl::string_view contents) {
  // Create parent directory, if necessary.
  std::string::size_type slash_pos = name.find_last_of('/');
  if (slash_pos != std::string::npos) {
    absl::string_view dir = name.substr(0, slash_pos);
    if (!FileExists(absl::StrCat(temp_directory_, "/", dir))) {
      ABSL_CHECK_OK(File::RecursivelyCreateDir(
          absl::StrCat(temp_directory_, "/", dir), 0777));
    }
  }

  // Write file.
  std::string full_name = absl::StrCat(temp_directory_, "/", name);
  ABSL_CHECK_OK(File::SetContents(
      full_name, absl::StrReplaceAll(contents, {{"$tmpdir", temp_directory_}}),
      true));
}